

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O1

void __thiscall
Saturation::PredicateSplitPassiveClauseContainer::PredicateSplitPassiveClauseContainer
          (PredicateSplitPassiveClauseContainer *this,bool isOutermost,Options *opt,string *name,
          vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
          *queues,vector<float,_std::allocator<float>_> *cutoffs,
          vector<int,_std::allocator<int>_> *ratios,bool layeredArrangement)

{
  vector<float,_std::allocator<float>_> *this_00;
  bool bVar1;
  uint uVar2;
  pointer pcVar3;
  iterator iVar4;
  unsigned_long uVar5;
  pointer puVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  int a;
  pointer piVar7;
  undefined8 *puVar8;
  long *plVar9;
  long lVar10;
  long *plVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  ulong uVar13;
  ulong uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  long local_140;
  long lStack_138;
  string *local_130;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_128;
  vector<float,_std::allocator<float>_> *local_120;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_118;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  char local_b0 [32];
  string local_90;
  long local_70;
  long local_68;
  long local_50;
  long local_48;
  
  pcVar3 = (name->_M_dataplus)._M_p;
  local_130 = name;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar3,pcVar3 + name->_M_string_length);
  PassiveClauseContainer::PassiveClauseContainer
            (&this->super_PassiveClauseContainer,isOutermost,opt,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  (this->super_PassiveClauseContainer).super_RandomAccessClauseContainer.super_ClauseContainer.
  _vptr_ClauseContainer = (_func_int **)&PTR__PredicateSplitPassiveClauseContainer_00b6b370;
  (this->_ratios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_ratios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_ratios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar6 = (queues->
           super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->_queues).
  super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (queues->
       super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->_queues).
  super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar6;
  (this->_queues).
  super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (queues->
       super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (queues->
  super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (queues->
  super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (queues->
  super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &this->_cutoffs;
  local_118 = &this->_ratios;
  std::vector<float,_std::allocator<float>_>::vector(this_00,cutoffs);
  local_128 = &this->_invertedRatios;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->_balances;
  (this->_balances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_balances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_invertedRatios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_balances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_invertedRatios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_invertedRatios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_layeredArrangement = layeredArrangement;
  (this->_simulationBalances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_simulationBalances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_simulationBalances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = (bool)(opt->_randomAWR).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92;
  this->_randomize = bVar1;
  lVar10 = (long)(this->_queues).
                 super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->_queues).
                 super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3;
  local_120 = this_00;
  if ((long)(ratios->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(ratios->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start >> 2 != lVar10) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(0x50);
    std::operator+(&local_d0,"Queue ",local_130);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_160.field_2._M_allocated_capacity = *plVar9;
    plVar11 = plVar9 + 2;
    if ((long *)local_160.field_2._M_allocated_capacity == plVar11) {
      local_140 = *plVar11;
      lStack_138 = plVar9[3];
      local_160.field_2._M_allocated_capacity = (size_type)&local_140;
    }
    else {
      local_140 = *plVar11;
    }
    local_160.field_2._8_8_ = plVar9[1];
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ::Lib::Int::toString_abi_cxx11_
              (&local_f0,
               (Int *)((long)(ratios->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(ratios->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start >> 2),local_160.field_2._8_8_);
    std::operator+(in_stack_fffffffffffffe90,__rhs);
    plVar9 = (long *)std::__cxx11::string::append(local_b0);
    pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar9;
    pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar9 + 2);
    if (pbVar15 == pbVar12) {
      local_160._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
      local_160._M_string_length = plVar9[3];
      pbVar15 = &local_160;
    }
    else {
      local_160._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
    }
    uVar5 = plVar9[1];
    *plVar9 = (long)pbVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ::Lib::Int::toString_abi_cxx11_
              (&local_110,
               (Int *)((long)(this->_queues).
                             super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->_queues).
                             super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3),uVar5);
    std::operator+(pbVar15,__rhs);
    *puVar8 = &PTR_cry_00b69f40;
    puVar8[1] = puVar8 + 3;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar8 + 1),local_50,local_48 + local_50);
    *puVar8 = &PTR_cry_00b6a028;
    *(undefined4 *)(puVar8 + 5) = 0;
    puVar8[6] = puVar8 + 8;
    puVar8[7] = 0;
    *(undefined1 *)(puVar8 + 8) = 0;
    __cxa_throw(puVar8,&::Lib::UserErrorException::typeinfo,
                ::Lib::UserErrorException::~UserErrorException);
  }
  if ((long)(this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start >> 2 != lVar10) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(0x50);
    std::operator+(&local_d0,"Queue ",local_130);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_160.field_2._M_allocated_capacity = *plVar9;
    plVar11 = plVar9 + 2;
    if ((long *)local_160.field_2._M_allocated_capacity == plVar11) {
      local_140 = *plVar11;
      lStack_138 = plVar9[3];
      local_160.field_2._M_allocated_capacity = (size_type)&local_140;
    }
    else {
      local_140 = *plVar11;
    }
    local_160.field_2._8_8_ = plVar9[1];
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ::Lib::Int::toString_abi_cxx11_
              (&local_f0,
               (Int *)((long)(this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 2),local_160.field_2._8_8_)
    ;
    std::operator+(in_stack_fffffffffffffe90,__rhs);
    plVar9 = (long *)std::__cxx11::string::append(local_b0);
    pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar9;
    pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar9 + 2);
    if (pbVar15 == pbVar12) {
      local_160._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
      local_160._M_string_length = plVar9[3];
      pbVar15 = &local_160;
    }
    else {
      local_160._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
    }
    uVar5 = plVar9[1];
    *plVar9 = (long)pbVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ::Lib::Int::toString_abi_cxx11_
              (&local_110,
               (Int *)((long)(this->_queues).
                             super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->_queues).
                             super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3),uVar5);
    std::operator+(pbVar15,__rhs);
    *puVar8 = &PTR_cry_00b69f40;
    puVar8[1] = puVar8 + 3;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar8 + 1),local_70,local_68 + local_70);
    *puVar8 = &PTR_cry_00b6a028;
    *(undefined4 *)(puVar8 + 5) = 0;
    puVar8[6] = puVar8 + 8;
    puVar8[7] = 0;
    *(undefined1 *)(puVar8 + 8) = 0;
    __cxa_throw(puVar8,&::Lib::UserErrorException::typeinfo,
                ::Lib::UserErrorException::~UserErrorException);
  }
  if (bVar1 != false) {
    this->_ratioSum = 0;
    piVar7 = (ratios->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    if ((ratios->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish != piVar7) {
      uVar14 = 0;
      uVar13 = 1;
      do {
        uVar2 = piVar7[uVar14];
        this->_ratioSum = this->_ratioSum + uVar2;
        iVar4._M_current =
             (this->_ratios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->_ratios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->_ratios,iVar4,
                     (uint *)&stack0xfffffffffffffe90);
        }
        else {
          *iVar4._M_current = uVar2;
          (this->_ratios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        piVar7 = (ratios->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        bVar1 = uVar13 < (ulong)((long)(ratios->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar7 >> 2
                                );
        uVar14 = uVar13;
        uVar13 = (ulong)((int)uVar13 + 1);
      } while (bVar1);
    }
  }
  piVar7 = (ratios->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar10 = (long)(ratios->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)piVar7;
  if (lVar10 == 0) {
    a = 1;
  }
  else {
    a = 1;
    uVar14 = 0;
    do {
      a = computeLCM(a,piVar7[uVar14]);
      uVar14 = uVar14 + 1;
    } while ((uVar14 & 0xffffffff) < (ulong)(lVar10 >> 2));
  }
  this_01 = local_128;
  piVar7 = (ratios->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((ratios->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar7) {
    uVar14 = 0;
    uVar13 = 1;
    do {
      iVar4._M_current =
           (this->_invertedRatios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->_invertedRatios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (this_01,iVar4,(uint *)&stack0xfffffffffffffe90);
      }
      else {
        *iVar4._M_current = a / piVar7[uVar14];
        (this->_invertedRatios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      iVar4._M_current =
           (this->_balances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->_balances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__rhs,iVar4,
                   (uint *)&stack0xfffffffffffffe90);
      }
      else {
        *iVar4._M_current = 0;
        (this->_balances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      piVar7 = (ratios->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar1 = uVar13 < (ulong)((long)(ratios->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                     .super__Vector_impl_data._M_finish - (long)piVar7 >> 2);
      uVar14 = uVar13;
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (bVar1);
  }
  return;
}

Assistant:

PredicateSplitPassiveClauseContainer::PredicateSplitPassiveClauseContainer(bool isOutermost, const Shell::Options& opt, std::string name,
    std::vector<std::unique_ptr<PassiveClauseContainer>> queues,
    std::vector<float> cutoffs, std::vector<int> ratios, bool layeredArrangement)
  : PassiveClauseContainer(isOutermost, opt, name), _queues(std::move(queues)), _cutoffs(cutoffs), _layeredArrangement(layeredArrangement)
{
  _randomize = opt.randomAWR();

  // sanity checks
  if (ratios.size() != _queues.size()) {
    USER_ERROR("Queue " + name + ": The number of ratios needs to match the number of queues, but " + Int::toString(ratios.size()) + " != " + Int::toString(_queues.size()));
  }
  if (_cutoffs.size() != _queues.size()) {
    USER_ERROR("Queue " + name + ": The number of cutoffs needs to match the number of queues, but " + Int::toString(_cutoffs.size()) + " != " + Int::toString(_queues.size()));
  }

  if (_randomize) {
    _ratioSum = 0;
    for (unsigned i = 0; i < ratios.size(); i++) {
      unsigned ri = ratios[i];
      _ratioSum += ri;
      _ratios.push_back(ri);
    }
  }

  // even when randomizing true selection, we rely on the old ways for simulation:

  // compute lcm, which will be used to compute reverse ratios
  auto lcm = 1;
  for (unsigned i = 0; i < ratios.size(); i++)
  {
    lcm = computeLCM(lcm, ratios[i]);
  }
  // initialize
  for (unsigned i = 0; i < ratios.size(); i++)
  {
    _invertedRatios.push_back(lcm / ratios[i]);
    _balances.push_back(0);
  }
}